

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  bool bVar3;
  char *c_local;
  stbi__context *s_local;
  
  while( true ) {
    while( true ) {
      iVar2 = stbi__at_eof(s);
      bVar3 = false;
      if (iVar2 == 0) {
        iVar2 = stbi__pnm_isspace(*c);
        bVar3 = iVar2 != 0;
      }
      if (!bVar3) break;
      sVar1 = stbi__get8(s);
      *c = sVar1;
    }
    iVar2 = stbi__at_eof(s);
    if ((iVar2 != 0) || (*c != '#')) break;
    while( true ) {
      iVar2 = stbi__at_eof(s);
      bVar3 = false;
      if ((iVar2 == 0) && (bVar3 = false, *c != '\n')) {
        bVar3 = *c != '\r';
      }
      if (!bVar3) break;
      sVar1 = stbi__get8(s);
      *c = sVar1;
    }
  }
  return;
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   for (;;) {
      while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
         *c = (char) stbi__get8(s);

      if (stbi__at_eof(s) || *c != '#')
         break;

      while (!stbi__at_eof(s) && *c != '\n' && *c != '\r' )
         *c = (char) stbi__get8(s);
   }
}